

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O0

void __thiscall apngasm::APNGAsm::dirtyTransparencyOptimization(APNGAsm *this,uchar coltype)

{
  uchar *puVar1;
  reference pvVar2;
  uint local_44;
  uchar *puStack_40;
  uint j_1;
  uchar *sp_1;
  size_t n_1;
  uchar *puStack_28;
  uint j;
  uchar *sp;
  size_t n;
  uchar coltype_local;
  APNGAsm *this_local;
  
  if (coltype == '\x06') {
    for (sp = (uchar *)0x0;
        puVar1 = (uchar *)std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                                    (&this->_frames), sp < puVar1; sp = sp + 1) {
      pvVar2 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,(size_type)sp);
      puStack_28 = pvVar2->_pixels;
      for (n_1._4_4_ = 0; n_1._4_4_ < this->_size; n_1._4_4_ = n_1._4_4_ + 1) {
        if (puStack_28[3] == '\0') {
          puStack_28[2] = '\0';
          puStack_28[1] = '\0';
          *puStack_28 = '\0';
        }
        puStack_28 = puStack_28 + 4;
      }
    }
  }
  else if (coltype == '\x04') {
    for (sp_1 = (uchar *)0x0;
        puVar1 = (uchar *)std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::size
                                    (&this->_frames), sp_1 < puVar1; sp_1 = sp_1 + 1) {
      pvVar2 = std::vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>::operator[]
                         (&this->_frames,(size_type)sp_1);
      puStack_40 = pvVar2->_pixels;
      for (local_44 = 0; local_44 < this->_size; local_44 = local_44 + 1) {
        if (puStack_40[1] == '\0') {
          *puStack_40 = '\0';
        }
        puStack_40 = puStack_40 + 2;
      }
    }
  }
  return;
}

Assistant:

void APNGAsm::dirtyTransparencyOptimization(unsigned char coltype)
  {
    if (coltype == 6)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=4)
          if (sp[3] == 0)
             sp[0] = sp[1] = sp[2] = 0;
      }
    }
    else
    if (coltype == 4)
    {
      for (size_t n = 0; n < _frames.size(); ++n)
      {
        unsigned char * sp = _frames[n]._pixels;
        for (unsigned int j=0; j<_size; j++, sp+=2)
          if (sp[1] == 0)
            sp[0] = 0;
      }
    }
  }